

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O3

void __thiscall
spdlog::details::registry::apply_all
          (registry *this,function<void_(std::shared_ptr<spdlog::logger>)> *fun)

{
  _Hash_node_base *p_Var1;
  int iVar2;
  shared_ptr<spdlog::logger> local_38;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    p_Var1 = (this->loggers_)._M_h._M_before_begin._M_nxt;
    while( true ) {
      if (p_Var1 == (_Hash_node_base *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)this);
        return;
      }
      local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var1[5]._M_nxt;
      local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var1[6]._M_nxt;
      if (local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          )->_M_use_count =
               (local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          )->_M_use_count =
               (local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi)->_M_use_count + 1;
        }
      }
      if ((fun->super__Function_base)._M_manager == (_Manager_type)0x0) break;
      (*fun->_M_invoker)((_Any_data *)fun,&local_38);
      if (local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      p_Var1 = p_Var1->_M_nxt;
    }
    iVar2 = std::__throw_bad_function_call();
  }
  std::__throw_system_error(iVar2);
}

Assistant:

SPDLOG_INLINE void registry::apply_all(const std::function<void(const std::shared_ptr<logger>)> &fun)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    for (auto &l : loggers_)
    {
        fun(l.second);
    }
}